

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references.cpp
# Opt level: O0

void CreateBackwardReferencesNH65
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals)

{
  byte bVar1;
  int iVar2;
  uint32_t uVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  byte bVar8;
  char *in_RCX;
  long in_RDX;
  ulong in_RSI;
  ulong in_RDI;
  long in_R8;
  long in_R9;
  bool bVar9;
  long in_stack_00000008;
  int *in_stack_00000010;
  ulong *in_stack_00000018;
  undefined4 *in_stack_00000020;
  long *in_stack_00000028;
  long *in_stack_00000030;
  size_t pos_jump_1;
  size_t kMargin_1;
  size_t pos_jump;
  size_t kMargin;
  size_t range_end;
  size_t range_start;
  size_t distance_code;
  HasherSearchResult sr2;
  size_t cost_diff_lazy;
  int delayed_backward_references_in_row;
  uint8_t p2;
  uint8_t p1;
  int dict_id;
  HasherSearchResult sr;
  size_t dictionary_start;
  size_t max_distance;
  size_t max_length;
  size_t kMinScore;
  size_t gap;
  size_t apply_random_heuristics;
  size_t random_heuristics_window_size;
  size_t store_end;
  size_t pos_end;
  size_t insert_length;
  Command *orig_commands;
  size_t position_offset;
  size_t max_backward_limit;
  H65 *privat;
  size_t offset1;
  size_t offset0;
  size_t distance_plus_3;
  uint32_t delta;
  size_t nbits;
  size_t offset_2;
  size_t prefix;
  size_t postfix;
  size_t postfix_mask;
  size_t bucket_2;
  size_t dist;
  uint16_t copycode;
  uint16_t inscode;
  uint32_t nbits_1;
  uint32_t nbits_2;
  uint32_t offset_3;
  uint16_t bits64;
  size_t b_5;
  size_t a_5;
  size_t b_4;
  size_t a_4;
  size_t b_1;
  size_t a_1;
  size_t b;
  size_t a;
  int next_last_distance_1;
  int last_distance_1;
  int next_last_distance;
  int last_distance;
  size_t b_3;
  size_t a_3;
  size_t b_2;
  size_t a_2;
  size_t score_5;
  size_t len_4;
  size_t backward_5;
  uint32_t current4_1;
  size_t prev_ix_3;
  size_t max_length_m4_1;
  uint32_t first4_1;
  size_t down_1;
  uint32_t *bucket_1;
  size_t key_2;
  size_t score_4;
  size_t len_3;
  size_t prev_ix_2;
  size_t backward_4;
  size_t i_2;
  size_t best_len_1;
  size_t best_score_1;
  size_t min_score_1;
  size_t cur_ix_masked_2;
  uint32_t *buckets_1;
  uint16_t *num_1;
  size_t matching_bits_5;
  uint64_t x_5;
  uint8_t *s1_orig_5;
  size_t matching_bits_4;
  uint64_t x_4;
  uint8_t *s1_orig_4;
  int item_matches_1;
  size_t i_3;
  size_t key_3;
  uint64_t t_13;
  uint64_t t_12;
  uint64_t t_18;
  uint64_t t_17;
  uint32_t t_16;
  uint32_t t_15;
  uint32_t h_3;
  uint32_t t_19;
  size_t transform_id_1;
  size_t cut_1;
  size_t score_6;
  size_t backward_6;
  size_t matchlen_1;
  size_t offset_1;
  size_t matching_bits_6;
  uint64_t x_6;
  uint8_t *s1_orig_6;
  uint64_t t_21;
  uint64_t t_20;
  uint64_t h_2;
  uint64_t t_14;
  size_t score_1;
  size_t len_1;
  size_t backward_1;
  uint32_t current4;
  size_t prev_ix_1;
  size_t max_length_m4;
  uint32_t first4;
  size_t down;
  uint32_t *bucket;
  size_t key;
  size_t score;
  size_t len;
  size_t prev_ix;
  size_t backward;
  size_t i;
  size_t best_len;
  size_t best_score;
  size_t min_score;
  size_t cur_ix_masked;
  uint32_t *buckets;
  uint16_t *num;
  size_t matching_bits_1;
  uint64_t x_1;
  uint8_t *s1_orig_1;
  size_t matching_bits;
  uint64_t x;
  uint8_t *s1_orig;
  int item_matches;
  size_t i_1;
  size_t key_1;
  uint64_t t_1;
  uint64_t t;
  uint64_t t_6;
  uint64_t t_5;
  uint32_t t_4;
  uint32_t t_3;
  uint32_t h_1;
  uint32_t t_7;
  size_t transform_id;
  size_t cut;
  size_t score_2;
  size_t backward_2;
  size_t matchlen;
  size_t offset;
  size_t matching_bits_2;
  uint64_t x_2;
  uint8_t *s1_orig_2;
  uint64_t t_9;
  uint64_t t_8;
  uint64_t h;
  uint64_t t_2;
  size_t i_4;
  size_t offset_4;
  size_t minor_ix;
  size_t key_4;
  uint32_t *buckets_2;
  uint16_t *num_2;
  uint64_t h_4;
  uint64_t t_24;
  size_t offset_6;
  size_t minor_ix_2;
  size_t key_6;
  uint32_t *buckets_4;
  uint16_t *num_4;
  uint64_t h_6;
  uint64_t t_26;
  size_t offset_5;
  size_t minor_ix_1;
  size_t key_5;
  uint32_t *buckets_3;
  uint16_t *num_3;
  uint64_t h_5;
  uint64_t t_25;
  size_t score_3;
  size_t len_2;
  size_t found_ix_masked;
  size_t backward_3;
  size_t found_ix;
  uint8_t add;
  uint8_t rem;
  uint32_t code;
  size_t pos;
  size_t cur_ix_masked_1;
  size_t matching_bits_3;
  uint64_t x_3;
  uint8_t *s1_orig_3;
  uint64_t t_11;
  uint64_t t_10;
  size_t score_7;
  size_t len_5;
  size_t found_ix_masked_1;
  size_t backward_7;
  size_t found_ix_1;
  uint8_t add_1;
  uint8_t rem_1;
  uint32_t code_1;
  size_t pos_1;
  size_t cur_ix_masked_3;
  size_t matching_bits_7;
  uint64_t x_7;
  uint8_t *s1_orig_7;
  uint64_t t_23;
  uint64_t t_22;
  ulong local_1198;
  undefined8 in_stack_ffffffffffffee78;
  ulong in_stack_ffffffffffffee80;
  ulong local_1168;
  ulong local_1160;
  ulong local_1150;
  ulong local_1138;
  ulong local_1118;
  ulong local_1108;
  ulong local_1100;
  char *local_10f8;
  char *local_10f0;
  ulong local_10e0;
  ulong local_10c8;
  ulong local_10c0;
  ulong local_10a8;
  ulong local_1058;
  ulong local_1048;
  ulong local_1040;
  ulong local_1038;
  undefined4 local_1030;
  undefined4 uStack_102c;
  undefined8 local_1028;
  int local_101c;
  byte local_1016;
  byte local_1015;
  uint local_1014;
  ulong local_1010;
  ulong local_1008;
  ulong local_1000;
  ulong local_ff8;
  ulong local_ff0;
  ulong local_fe8;
  char *local_fe0;
  undefined8 local_fd8;
  long local_fd0;
  ulong local_fc8;
  long local_fc0;
  ulong local_fb8;
  ulong local_fb0;
  ulong local_fa8;
  undefined4 *local_fa0;
  long local_f98;
  ulong local_f90;
  long local_f88;
  long local_f80;
  long local_f78;
  char *local_f70;
  long local_f68;
  ulong local_f60;
  ulong local_f48;
  ulong local_f40;
  ulong local_f38;
  ulong local_f30;
  ulong local_f28;
  ulong local_f20;
  ulong local_f18;
  ulong local_f10;
  ulong local_f08;
  ulong local_f00;
  ulong local_ef8;
  ulong local_ef0;
  ulong local_ee8;
  ulong local_ee0;
  char *local_ed8;
  char *local_ed0;
  ulong local_ec8;
  ulong local_ec0;
  ulong local_eb8;
  ulong local_eb0;
  ulong local_ea8;
  ulong local_ea0;
  long local_e98;
  ulong local_e88;
  ulong local_e80;
  ulong local_e78;
  uint local_e6c;
  ulong local_e68;
  uint local_e5c;
  ulong local_e58;
  ulong local_e50;
  uint *local_e48;
  undefined4 *local_e40;
  undefined8 local_e38;
  undefined8 local_e30;
  undefined8 local_e28;
  undefined8 local_e20;
  ulong local_e18;
  ulong local_e10;
  long local_e08;
  long local_e00;
  ulong local_df8;
  ulong local_df0;
  ulong local_de8;
  ulong local_de0;
  ulong local_dd8;
  undefined4 *local_dd0;
  ushort *local_dc8;
  ulong local_dc0;
  ulong local_db8;
  ulong local_db0;
  ulong local_da8;
  ushort local_d9c;
  ushort local_d9a;
  ushort *local_d98;
  uint local_d8c;
  ulong local_d88;
  ulong local_d80;
  int local_d74;
  ulong local_d70;
  ushort local_d62;
  long local_d60;
  long local_d58;
  int local_d4c;
  ulong local_d48;
  ushort local_d3a;
  long local_d38;
  long local_d30;
  int local_d24;
  ushort local_d1e;
  uint local_d1c;
  ushort local_d16;
  ushort local_d14;
  ushort local_d12;
  undefined8 local_d10;
  undefined8 local_d08;
  undefined8 local_d00;
  undefined8 local_cf8;
  undefined8 local_cf0;
  undefined8 local_ce8;
  undefined8 local_ce0;
  undefined8 local_cd8;
  long local_cc8;
  long local_cb8;
  int local_cac;
  int local_ca8;
  int local_ca4;
  long local_c90;
  long local_c80;
  int local_c74;
  int local_c70;
  int local_c6c;
  undefined8 local_c60;
  undefined8 local_c58;
  undefined8 local_c50;
  undefined8 local_c48;
  ulong *local_c40;
  ulong local_c38;
  long local_c30;
  ulong local_c28;
  char *local_c20;
  ulong local_c18;
  int *local_c10;
  char *local_c08;
  long local_c00;
  long *local_bf8;
  long local_bf0;
  ulong local_be8;
  char *local_be0;
  ulong local_bd8;
  int local_bcc;
  ulong local_bc8;
  char *local_bc0;
  int local_bb4;
  ulong local_bb0;
  long local_ba8;
  ulong local_ba0;
  ulong local_b98;
  char *local_b90;
  ulong local_b88;
  ulong local_b80;
  ulong local_b78;
  char *local_b70;
  ulong local_b68;
  ulong local_b60;
  ulong local_b58;
  long local_b50;
  long local_b48;
  ulong *local_b40;
  ulong local_b38;
  long local_b30;
  ulong local_b28;
  char *local_b20;
  ulong local_b18;
  int *local_b10;
  char *local_b08;
  long local_b00;
  long *local_af8;
  long local_af0;
  ulong local_ae8;
  ulong local_ae0;
  ulong *local_ad8;
  char *local_ad0;
  ulong *local_ac8;
  ulong *local_ac0;
  char *local_ab8;
  ulong local_ab0;
  ulong local_aa8;
  ulong *local_aa0;
  char *local_a98;
  ulong *local_a90;
  ulong *local_a88;
  char *local_a80;
  char *local_a78;
  ulong local_a70;
  ulong local_a68;
  char *local_a60;
  int local_a54;
  ulong local_a50;
  ulong local_a48;
  int local_a3c;
  ulong *local_a38;
  ulong local_a30;
  long local_a28;
  char *local_a20;
  ulong *local_a18;
  long local_a10;
  long *local_a08;
  ulong local_a00;
  ulong *local_9f8;
  ulong local_9f0;
  ulong *local_9e8;
  ulong local_9e0;
  ulong *local_9d8;
  ulong local_9d0;
  ulong *local_9c8;
  int local_9bc;
  int *local_9b8;
  int local_9ac;
  int *local_9a8;
  ulong local_9a0;
  uint local_994;
  ulong *local_990;
  int local_984;
  ulong *local_980;
  long local_978;
  long local_970;
  ulong local_968;
  ulong local_960;
  char *local_958;
  long local_950;
  ulong *local_948;
  ulong local_940;
  long local_938;
  char *local_930;
  ulong *local_928;
  ulong local_920;
  char *local_918;
  long *local_910;
  int local_904;
  ulong local_900;
  ulong local_8f8;
  ulong *local_8f0;
  char *local_8e8;
  ulong *local_8e0;
  ulong *local_8d8;
  char *local_8d0;
  ulong local_8c8;
  char *local_8c0;
  ulong local_8b8;
  ulong *local_8b0;
  ulong local_8a8;
  ulong *local_8a0;
  ulong local_898;
  ulong local_890;
  long local_888;
  long *local_880;
  long local_878;
  long *local_870;
  ulong *local_868;
  ulong local_860;
  long local_858;
  ulong local_850;
  char *local_848;
  ulong local_840;
  int *local_838;
  char *local_830;
  long local_828;
  long *local_820;
  long local_818;
  ulong local_810;
  char *local_808;
  ulong local_800;
  int local_7f4;
  ulong local_7f0;
  char *local_7e8;
  int local_7dc;
  ulong local_7d8;
  long local_7d0;
  ulong local_7c8;
  ulong local_7c0;
  char *local_7b8;
  ulong local_7b0;
  ulong local_7a8;
  ulong local_7a0;
  char *local_798;
  ulong local_790;
  ulong local_788;
  ulong local_780;
  long local_778;
  long local_770;
  ulong *local_768;
  ulong local_760;
  long local_758;
  ulong local_750;
  char *local_748;
  ulong local_740;
  int *local_738;
  char *local_730;
  long local_728;
  long *local_720;
  long local_718;
  ulong local_710;
  ulong local_708;
  ulong *local_700;
  char *local_6f8;
  ulong *local_6f0;
  ulong *local_6e8;
  char *local_6e0;
  ulong local_6d8;
  ulong local_6d0;
  ulong *local_6c8;
  char *local_6c0;
  ulong *local_6b8;
  ulong *local_6b0;
  char *local_6a8;
  char *local_6a0;
  ulong local_698;
  ulong local_690;
  char *local_688;
  int local_67c;
  ulong local_678;
  ulong local_670;
  int local_664;
  ulong *local_660;
  ulong local_658;
  long local_650;
  char *local_648;
  ulong *local_640;
  long local_638;
  long *local_630;
  ulong local_628;
  ulong *local_620;
  ulong local_618;
  ulong *local_610;
  ulong local_608;
  ulong *local_600;
  ulong local_5f8;
  ulong *local_5f0;
  int local_5e4;
  int *local_5e0;
  int local_5d4;
  int *local_5d0;
  ulong local_5c8;
  uint local_5bc;
  ulong *local_5b8;
  int local_5ac;
  ulong *local_5a8;
  long local_5a0;
  long local_598;
  ulong local_590;
  ulong local_588;
  char *local_580;
  long local_578;
  ulong *local_570;
  ulong local_568;
  long local_560;
  char *local_558;
  ulong *local_550;
  ulong local_548;
  char *local_540;
  long *local_538;
  int local_52c;
  ulong local_528;
  ulong local_520;
  ulong *local_518;
  char *local_510;
  ulong *local_508;
  ulong *local_500;
  char *local_4f8;
  ulong local_4f0;
  char *local_4e8;
  ulong local_4e0;
  ulong *local_4d8;
  ulong local_4d0;
  ulong *local_4c8;
  ulong local_4c0;
  ulong local_4b8;
  long local_4b0;
  long *local_4a8;
  long local_4a0;
  long *local_498;
  ulong local_490;
  ulong local_488;
  char *local_480;
  long local_478;
  long local_470;
  ulong local_468;
  ulong local_460;
  ulong local_458;
  char *local_450;
  long local_448;
  long local_440;
  long local_438;
  ulong local_430;
  ulong local_428;
  long local_420;
  long local_418;
  ulong local_410;
  long local_3f8;
  ulong local_3f0;
  long local_3e8;
  long *local_3e0;
  long local_3d8;
  long *local_3d0;
  ulong local_3c8;
  long local_3b0;
  long local_3a8;
  ulong local_3a0;
  ulong local_398;
  long local_390;
  long local_388;
  ulong local_380;
  long local_368;
  ulong local_360;
  long local_358;
  long *local_350;
  long local_348;
  long *local_340;
  ulong local_338;
  long local_320;
  long local_318;
  ulong local_310;
  ulong local_308;
  long local_300;
  long local_2f8;
  ulong local_2f0;
  long local_2d8;
  ulong local_2d0;
  long local_2c8;
  long *local_2c0;
  long local_2b8;
  long *local_2b0;
  long local_2a0;
  long local_290;
  ulong local_288;
  char *local_280;
  ulong local_278;
  ulong local_270;
  ulong local_268;
  undefined1 local_25e;
  undefined1 local_25d;
  uint local_25c;
  ulong local_258;
  ulong local_250;
  ulong *local_248;
  ulong local_240;
  long local_238;
  ulong local_230;
  char *local_228;
  ulong local_220;
  int *local_218;
  char *local_210;
  long local_208;
  long *local_200;
  uint *local_1f8;
  ulong local_1f0;
  ulong local_1e8;
  ulong *local_1e0;
  char *local_1d8;
  ulong *local_1d0;
  ulong *local_1c8;
  char *local_1c0;
  ulong local_1b8;
  char *local_1b0;
  ulong local_1a8;
  ulong *local_1a0;
  ulong local_198;
  ulong *local_190;
  ulong local_188;
  ulong local_180;
  char *local_178;
  ulong local_170;
  ulong local_168;
  ulong local_160;
  undefined1 local_156;
  undefined1 local_155;
  uint local_154;
  ulong local_150;
  ulong local_148;
  ulong *local_140;
  ulong local_138;
  long local_130;
  ulong local_128;
  char *local_120;
  ulong local_118;
  int *local_110;
  char *local_108;
  long local_100;
  long *local_f8;
  uint *local_f0;
  ulong local_e8;
  ulong local_e0;
  ulong *local_d8;
  char *local_d0;
  ulong *local_c8;
  ulong *local_c0;
  char *local_b8;
  ulong local_b0;
  char *local_a8;
  ulong local_a0;
  ulong *local_98;
  ulong local_90;
  ulong *local_88;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  char *local_68;
  long local_60;
  long local_58;
  ulong local_50;
  long local_38;
  ulong local_30;
  long local_18;
  
  local_f88 = in_stack_00000008 + 0x50;
  local_f90 = (1L << ((byte)*(undefined4 *)(in_R9 + 8) & 0x3f)) - 0x10;
  local_f98 = *(long *)(in_R9 + 0x10);
  local_fa0 = in_stack_00000020;
  local_fa8 = *in_stack_00000018;
  local_fb0 = in_RSI + in_RDI;
  local_cd8 = 8;
  local_ce0 = 4;
  local_10a8 = in_RSI;
  if (7 < in_RDI) {
    local_ce8 = 8;
    local_cf0 = 4;
    local_10a8 = (in_RSI + in_RDI) - 7;
  }
  local_fb8 = local_10a8;
  iVar5 = 0x200;
  if (*(int *)(in_R9 + 4) < 9) {
    iVar5 = 0x40;
  }
  local_fc0 = (long)iVar5;
  local_fc8 = in_RSI + local_fc0;
  local_fd0 = *(long *)(in_R9 + 0x60);
  local_fd8 = 0x7e4;
  local_c6c = *(int *)(in_stack_00000008 + 0x70);
  if (4 < local_c6c) {
    local_c70 = *in_stack_00000010;
    in_stack_00000010[4] = local_c70 + -1;
    in_stack_00000010[5] = local_c70 + 1;
    in_stack_00000010[6] = local_c70 + -2;
    in_stack_00000010[7] = local_c70 + 2;
    in_stack_00000010[8] = local_c70 + -3;
    in_stack_00000010[9] = local_c70 + 3;
    if (10 < local_c6c) {
      local_c74 = in_stack_00000010[1];
      in_stack_00000010[10] = local_c74 + -1;
      in_stack_00000010[0xb] = local_c74 + 1;
      in_stack_00000010[0xc] = local_c74 + -2;
      in_stack_00000010[0xd] = local_c74 + 2;
      in_stack_00000010[0xe] = local_c74 + -3;
      in_stack_00000010[0xf] = local_c74 + 3;
    }
  }
  local_2a0 = in_stack_00000008 + 0x90;
  local_f80 = in_R9;
  local_f78 = in_R8;
  local_f70 = in_RCX;
  local_f68 = in_RDX;
  uVar6 = in_RSI;
  local_c90 = local_f88;
  local_c80 = local_f88;
LAB_007ecf38:
  do {
    local_f60 = uVar6;
    local_c48 = 8;
    local_c50 = 4;
    if (local_fb0 <= local_f60 + 8) {
      *in_stack_00000018 = (local_fb0 - local_f60) + local_fa8;
      *in_stack_00000028 = ((long)in_stack_00000020 - (long)local_fa0 >> 4) + *in_stack_00000028;
      return;
    }
    local_fe0 = (char *)(local_fb0 - local_f60);
    local_eb0 = local_f60;
    local_eb8 = local_f90;
    if (local_f60 < local_f90) {
      local_10c0 = local_f60;
    }
    else {
      local_10c0 = local_f90;
    }
    local_fe8 = local_10c0;
    local_ec0 = local_f60 + local_f98;
    local_ec8 = local_f90;
    local_10c8 = local_ec0;
    if (local_f90 <= local_ec0) {
      local_10c8 = local_f90;
    }
    local_ff0 = local_10c8;
    local_1014 = 0;
    local_1015 = 0;
    local_1016 = 0;
    if (*(int *)(local_f80 + 0x270) != 0) {
      if (local_f60 == 0) {
        local_1015 = 0;
      }
      else {
        local_1015 = *(byte *)(local_f68 + (local_f60 - 1 & (ulong)local_f70));
      }
      if (local_f60 < 2) {
        local_1016 = 0;
      }
      else {
        local_1016 = *(byte *)(local_f68 + (local_f60 - 2 & (ulong)local_f70));
      }
      local_1014 = (uint)*(byte *)(local_f80 + 0x275 +
                                  (long)(int)(uint)(*(byte *)(local_f78 + (ulong)local_1015) |
                                                   *(byte *)(local_f78 + 0x100 + (ulong)local_1016))
                                  );
    }
    local_ff8 = local_ff8 & 0xffffffff00000000;
    local_1008 = 0;
    local_1000 = 0x7e4;
    local_820 = *(long **)(local_f80 + 0x2b8 + (long)(int)local_1014 * 8);
    local_858 = local_10c8 + local_fd0;
    local_860 = *(ulong *)(local_f80 + 0x48);
    local_818 = local_f88;
    local_828 = local_f68;
    local_830 = local_f70;
    local_838 = in_stack_00000010;
    local_840 = local_f60;
    local_850 = local_10c0;
    local_868 = &local_1010;
    local_718 = local_f88;
    local_728 = local_f68;
    local_730 = local_f70;
    local_738 = in_stack_00000010;
    local_740 = local_f60;
    local_750 = local_10c0;
    local_770 = *(long *)(local_f88 + 0x30);
    local_778 = *(long *)(local_f88 + 0x38);
    local_780 = local_f60 & (ulong)local_f70;
    local_788 = 0x7e4;
    local_790 = 0x7e4;
    local_798 = (char *)0x0;
    local_1010 = 0;
    local_ff8._0_4_ = 0;
    local_848 = local_fe0;
    local_768 = local_868;
    local_760 = local_860;
    local_758 = local_858;
    local_748 = local_fe0;
    local_720 = local_820;
    for (local_7a0 = 0; local_7a0 < (ulong)(long)*(int *)(local_718 + 0x20);
        local_7a0 = local_7a0 + 1) {
      local_7a8 = (ulong)local_738[local_7a0];
      local_7b0 = local_740 - local_7a8;
      if ((((local_7b0 < local_740) && (local_7a8 <= local_750)) &&
          (local_7b0 = (ulong)local_730 & local_7b0, local_798 + local_780 <= local_730)) &&
         ((local_798 + local_7b0 <= local_730 &&
          (local_798[local_728 + local_780] == local_798[local_728 + local_7b0])))) {
        local_6c8 = (ulong *)(local_728 + local_7b0);
        local_6b8 = (ulong *)(local_728 + local_780);
        local_6c0 = local_748;
        local_6b0 = local_6c8;
LAB_007ed55b:
        if (local_6c0 < (char *)0x8) {
          while( true ) {
            bVar9 = false;
            if (local_6c0 != (char *)0x0) {
              bVar9 = (char)*local_6b0 == (char)*local_6b8;
            }
            if (!bVar9) break;
            local_6c0 = local_6c0 + -1;
            local_6b8 = (ulong *)((long)local_6b8 + 1);
            local_6b0 = (ulong *)((long)local_6b0 + 1);
          }
          local_6a8 = (char *)((long)local_6b0 - (long)local_6c8);
        }
        else {
          local_610 = local_6b8;
          local_618 = *local_6b8;
          local_620 = local_6b0;
          local_628 = *local_6b0;
          local_6d0 = local_618 ^ local_628;
          local_6b8 = local_6b8 + 1;
          if (local_6d0 == 0) goto LAB_007ed62d;
          iVar5 = 0;
          for (uVar6 = local_6d0; (uVar6 & 1) == 0; uVar6 = uVar6 >> 1 | 0x8000000000000000) {
            iVar5 = iVar5 + 1;
          }
          local_6d8 = (ulong)iVar5;
          local_6a8 = (char *)((long)local_6b0 + ((local_6d8 >> 3) - (long)local_6c8));
        }
        local_7b8 = local_6a8;
        if (((char *)0x2 < local_6a8) || ((local_6a8 == (char *)0x2 && (local_7a0 < 2)))) {
          local_6a0 = local_6a8;
          local_7c0 = (long)local_6a8 * 0x87 + 0x78f;
          if (local_790 < local_7c0) {
            if (local_7a0 != 0) {
              local_698 = local_7a0;
              local_7c0 = local_7c0 - ((long)(int)(0x1ca10 >> ((byte)local_7a0 & 0xe) & 0xe) + 0x27)
              ;
            }
            if (local_790 < local_7c0) {
              local_790 = local_7c0;
              local_798 = local_6a8;
              *local_768 = (ulong)local_6a8;
              local_768[1] = local_7a8;
              local_768[2] = local_790;
            }
          }
        }
      }
    }
    local_4a8 = (long *)(local_728 + local_780);
    local_4b0 = *(long *)(local_718 + 0x10);
    local_4a0 = *local_4a8;
    local_4b8 = local_4a0 * local_4b0;
    local_7c8 = local_4b8 >> 0x31;
    local_7d0 = local_778 + (local_7c8 << ((byte)*(undefined4 *)(local_718 + 0x1c) & 0x3f)) * 4;
    if (*(ulong *)(local_718 + 8) < (ulong)*(ushort *)(local_770 + local_7c8 * 2)) {
      local_10e0 = (ulong)*(ushort *)(local_770 + local_7c8 * 2) - *(long *)(local_718 + 8);
    }
    else {
      local_10e0 = 0;
    }
    local_7d8 = local_10e0;
    local_5d0 = (int *)(local_728 + local_780);
    local_7dc = *local_5d0;
    local_7e8 = local_748 + -4;
    local_7a0 = (ulong)*(ushort *)(local_770 + local_7c8 * 2);
    local_5d4 = local_7dc;
    local_498 = local_4a8;
    while (local_7d8 < local_7a0) {
      local_7a0 = local_7a0 - 1;
      local_7f0 = (ulong)*(uint *)(local_7d0 + (local_7a0 & *(uint *)(local_718 + 0x18)) * 4);
      local_800 = local_740 - local_7f0;
      if (local_750 < local_800) break;
      local_7f0 = (ulong)local_730 & local_7f0;
      if (((local_798 + local_780 <= local_730) && (local_798 + local_7f0 <= local_730)) &&
         (local_798[local_728 + local_780] == local_798[local_728 + local_7f0])) {
        local_5e0 = (int *)(local_728 + local_7f0);
        local_7f4 = *local_5e0;
        local_5e4 = local_7f4;
        if (local_7dc == local_7f4) {
          local_700 = (ulong *)(local_728 + local_7f0 + 4);
          local_6f0 = (ulong *)(local_728 + local_780 + 4);
          local_6f8 = local_7e8;
          local_6e8 = local_700;
LAB_007edb7d:
          if (local_6f8 < (char *)0x8) {
            while( true ) {
              bVar9 = false;
              if (local_6f8 != (char *)0x0) {
                bVar9 = (char)*local_6e8 == (char)*local_6f0;
              }
              if (!bVar9) break;
              local_6f8 = local_6f8 + -1;
              local_6f0 = (ulong *)((long)local_6f0 + 1);
              local_6e8 = (ulong *)((long)local_6e8 + 1);
            }
            local_6e0 = (char *)((long)local_6e8 - (long)local_700);
          }
          else {
            local_5f0 = local_6f0;
            local_5f8 = *local_6f0;
            local_600 = local_6e8;
            local_608 = *local_6e8;
            local_708 = local_5f8 ^ local_608;
            local_6f0 = local_6f0 + 1;
            if (local_708 == 0) goto LAB_007edc4f;
            iVar5 = 0;
            for (uVar6 = local_708; (uVar6 & 1) == 0; uVar6 = uVar6 >> 1 | 0x8000000000000000) {
              iVar5 = iVar5 + 1;
            }
            local_710 = (ulong)iVar5;
            local_6e0 = (char *)((long)local_6e8 + ((local_710 >> 3) - (long)local_700));
          }
          local_808 = local_6e0 + 4;
          iVar5 = 0x1f;
          if ((uint)local_800 != 0) {
            for (; (uint)local_800 >> iVar5 == 0; iVar5 = iVar5 + -1) {
            }
          }
          local_810 = ((long)local_808 * 0x87 + 0x780) - (ulong)(uint)(iVar5 * 0x1e);
          local_690 = local_800;
          local_688 = local_808;
          local_5c8 = local_800;
          if (local_790 < local_810) {
            local_798 = local_808;
            local_790 = local_810;
            *local_768 = (ulong)local_808;
            local_768[1] = local_800;
            local_768[2] = local_790;
          }
        }
      }
    }
    *(int *)(local_7d0 +
            (ulong)((uint)*(ushort *)(local_770 + local_7c8 * 2) & *(uint *)(local_718 + 0x18)) * 4)
         = (int)local_740;
    *(short *)(local_770 + local_7c8 * 2) = *(short *)(local_770 + local_7c8 * 2) + 1;
    if (local_788 == local_768[2]) {
      local_638 = *(long *)(local_718 + 0x28);
      local_640 = (ulong *)(local_728 + local_780);
      local_630 = local_720;
      local_648 = local_748;
      local_650 = local_758;
      local_658 = local_760;
      local_660 = local_768;
      local_664 = 0;
      if (*(ulong *)(local_638 + 0x28) >> 7 <= *(ulong *)(local_638 + 0x30)) {
        local_5ac = (int)*local_640;
        local_5bc = local_5ac * 0x1e35a7bd;
        local_670 = (ulong)((local_5bc >> 0x12) << 1);
        local_678 = 0;
        local_5b8 = local_640;
        local_5a8 = local_640;
        while( true ) {
          uVar4 = 2;
          if (local_664 != 0) {
            uVar4 = 1;
          }
          if (uVar4 <= local_678) break;
          *(long *)(local_638 + 0x28) = *(long *)(local_638 + 0x28) + 1;
          if (*(char *)(local_630[4] + local_670) != '\0') {
            local_540 = (char *)(ulong)*(byte *)(local_630[4] + local_670);
            local_548 = (ulong)*(ushort *)(local_630[3] + local_670 * 2);
            local_538 = local_630;
            local_550 = local_640;
            local_558 = local_648;
            local_560 = local_650;
            local_568 = local_658;
            local_570 = local_660;
            local_578 = (ulong)*(uint *)(*local_630 + 0x20 + (long)local_540 * 4) +
                        (long)local_540 * local_548;
            if (local_648 < local_540) {
              local_52c = 0;
            }
            else {
              local_508 = (ulong *)(*(long *)(*local_630 + 0xa8) + local_578);
              local_500 = local_640;
              local_518 = local_640;
              local_510 = local_540;
LAB_007ee130:
              if (local_510 < (char *)0x8) {
                while( true ) {
                  bVar9 = false;
                  if (local_510 != (char *)0x0) {
                    bVar9 = (char)*local_500 == (char)*local_508;
                  }
                  if (!bVar9) break;
                  local_510 = local_510 + -1;
                  local_508 = (ulong *)((long)local_508 + 1);
                  local_500 = (ulong *)((long)local_500 + 1);
                }
                local_4f8 = (char *)((long)local_500 - (long)local_640);
              }
              else {
                local_4c8 = local_508;
                local_4d0 = *local_508;
                local_4d8 = local_500;
                local_4e0 = *local_500;
                local_520 = local_4d0 ^ local_4e0;
                local_508 = local_508 + 1;
                if (local_520 == 0) goto LAB_007ee202;
                iVar5 = 0;
                for (uVar6 = local_520; (uVar6 & 1) == 0; uVar6 = uVar6 >> 1 | 0x8000000000000000) {
                  iVar5 = iVar5 + 1;
                }
                local_528 = (ulong)iVar5;
                local_4f8 = (char *)((long)local_500 + ((local_528 >> 3) - (long)local_640));
              }
              local_580 = local_4f8;
              if ((local_540 < local_4f8 + *(uint *)((long)local_630 + 0xc)) &&
                 (local_4f8 != (char *)0x0)) {
                local_598 = (long)local_540 - (long)local_4f8;
                local_5a0 = local_598 * 4 +
                            ((ulong)local_630[2] >> ((char)local_598 * '\x06' & 0x3fU) & 0x3f);
                local_588 = local_650 + 1 + local_548 +
                            (local_5a0 << (local_540[*local_630] & 0x3fU));
                if (local_658 < local_588) {
                  local_52c = 0;
                }
                else {
                  local_4e8 = local_4f8;
                  iVar5 = 0x1f;
                  if ((uint)local_588 != 0) {
                    for (; (uint)local_588 >> iVar5 == 0; iVar5 = iVar5 + -1) {
                    }
                  }
                  local_590 = ((long)local_4f8 * 0x87 + 0x780) - (ulong)(uint)(iVar5 * 0x1e);
                  local_4f0 = local_588;
                  local_4c0 = local_588;
                  if (local_590 < local_660[2]) {
                    local_52c = 0;
                  }
                  else {
                    *local_660 = (ulong)local_4f8;
                    *(int *)(local_570 + 3) = (int)local_540 - (int)local_580;
                    local_570[1] = local_588;
                    local_570[2] = local_590;
                    local_52c = 1;
                  }
                }
              }
              else {
                local_52c = 0;
              }
            }
            local_67c = local_52c;
            if (local_52c != 0) {
              *(long *)(local_638 + 0x30) = *(long *)(local_638 + 0x30) + 1;
            }
          }
          local_678 = local_678 + 1;
          local_670 = local_670 + 1;
        }
      }
    }
    local_1f8 = (uint *)(local_818 + 0x40);
    local_200 = local_820;
    local_208 = local_828;
    local_210 = local_830;
    local_218 = local_838;
    local_220 = local_840;
    local_228 = local_848;
    local_230 = local_850;
    local_238 = local_858;
    local_240 = local_860;
    local_248 = local_868;
    local_250 = local_840 & (ulong)local_830;
    if ((char *)0x1f < local_848) {
      for (local_258 = *(ulong *)(local_818 + 0x50); local_258 <= local_220;
          local_258 = local_258 + 1) {
        local_25c = *local_1f8 & 0x3fffffff;
        local_25d = *(undefined1 *)(local_208 + (local_258 & (ulong)local_210));
        local_25e = *(undefined1 *)(local_208 + (local_258 + 0x20 & (ulong)local_210));
        local_268 = 0xffffffff;
        uVar3 = duckdb_brotli::HashRollingFunctionHROLLING
                          ((uint32_t)(in_stack_ffffffffffffee80 >> 0x20),
                           (uint8_t)(in_stack_ffffffffffffee80 >> 0x18),
                           (uint8_t)(in_stack_ffffffffffffee80 >> 0x10),
                           (uint32_t)((ulong)in_stack_ffffffffffffee78 >> 0x20),
                           (uint32_t)in_stack_ffffffffffffee78);
        *local_1f8 = uVar3;
        if (local_25c < 0x1000000) {
          uVar4 = *(uint *)(*(long *)(local_1f8 + 2) + (ulong)local_25c * 4);
          local_268 = (ulong)uVar4;
          *(int *)(*(long *)(local_1f8 + 2) + (ulong)local_25c * 4) = (int)local_258;
          if ((local_258 == local_220) && (local_268 != 0xffffffff)) {
            uVar4 = (int)local_220 - uVar4;
            local_270 = (ulong)uVar4;
            if (local_270 <= local_230) {
              local_278 = local_268 & (ulong)local_210;
              local_1e0 = (ulong *)(local_208 + local_278);
              local_1d0 = (ulong *)(local_208 + local_250);
              local_1d8 = local_228;
              local_1c8 = local_1e0;
LAB_007ee7e0:
              if (local_1d8 < (char *)0x8) {
                while( true ) {
                  bVar9 = false;
                  if (local_1d8 != (char *)0x0) {
                    bVar9 = (char)*local_1c8 == (char)*local_1d0;
                  }
                  if (!bVar9) break;
                  local_1d8 = local_1d8 + -1;
                  local_1d0 = (ulong *)((long)local_1d0 + 1);
                  local_1c8 = (ulong *)((long)local_1c8 + 1);
                }
                local_1c0 = (char *)((long)local_1c8 - (long)local_1e0);
              }
              else {
                local_190 = local_1d0;
                local_198 = *local_1d0;
                local_1a0 = local_1c8;
                local_1a8 = *local_1c8;
                local_1e8 = local_198 ^ local_1a8;
                local_1d0 = local_1d0 + 1;
                if (local_1e8 == 0) goto LAB_007ee8b2;
                iVar5 = 0;
                for (uVar6 = local_1e8; (uVar6 & 1) == 0; uVar6 = uVar6 >> 1 | 0x8000000000000000) {
                  iVar5 = iVar5 + 1;
                }
                local_1f0 = (ulong)iVar5;
                local_1c0 = (char *)((long)local_1c8 + ((local_1f0 >> 3) - (long)local_1e0));
              }
              local_280 = local_1c0;
              if (((char *)0x3 < local_1c0) && ((char *)*local_248 < local_1c0)) {
                local_1b0 = local_1c0;
                iVar5 = 0x1f;
                if (uVar4 != 0) {
                  for (; uVar4 >> iVar5 == 0; iVar5 = iVar5 + -1) {
                  }
                }
                local_288 = ((long)local_1c0 * 0x87 + 0x780) - (ulong)(uint)(iVar5 * 0x1e);
                local_1b8 = local_270;
                local_188 = local_270;
                if (local_248[2] < local_288) {
                  *local_248 = (ulong)local_1c0;
                  local_248[1] = local_270;
                  local_248[2] = local_288;
                  *(undefined4 *)(local_248 + 3) = 0;
                }
              }
            }
          }
        }
      }
      *(ulong *)(local_1f8 + 4) = local_220 + 1;
    }
    if (0x7e4 < local_1000) {
      local_101c = 0;
      do {
        local_fe0 = local_fe0 + -1;
        local_1028 = 0xaf;
        if (*(int *)(local_f80 + 4) < 5) {
          local_ed0 = (char *)(local_1010 - 1);
          local_ed8 = local_fe0;
          local_10f0 = local_ed0;
          if (local_fe0 <= local_ed0) {
            local_10f0 = local_fe0;
          }
          local_10f8 = local_10f0;
        }
        else {
          local_10f8 = (char *)0x0;
        }
        local_1040 = 0;
        local_1038 = 0x7e4;
        local_ee0 = local_f60 + 1;
        local_ee8 = local_f90;
        local_1100 = local_ee0;
        if (local_f90 <= local_ee0) {
          local_1100 = local_f90;
        }
        local_fe8 = local_1100;
        local_ef0 = local_f60 + 1 + local_f98;
        local_ef8 = local_f90;
        local_1108 = local_ef0;
        if (local_f90 <= local_ef0) {
          local_1108 = local_f90;
        }
        local_ff0 = local_1108;
        if (*(int *)(local_f80 + 0x270) != 0) {
          local_1016 = local_1015;
          bVar1 = *(byte *)(local_f68 + (local_f60 & (ulong)local_f70));
          local_1014 = (uint)*(byte *)(local_f80 + 0x275 +
                                      (long)(int)(uint)(*(byte *)(local_f78 + (ulong)bVar1) |
                                                       *(byte *)(local_f78 + 0x100 +
                                                                (ulong)local_1015)));
          local_1015 = bVar1;
        }
        local_bf8 = *(long **)(local_f80 + 0x2b8 + (long)(int)local_1014 * 8);
        local_c18 = local_f60 + 1;
        local_c30 = local_1108 + local_fd0;
        local_c38 = *(ulong *)(local_f80 + 0x48);
        local_bf0 = local_f88;
        local_c00 = local_f68;
        local_c08 = local_f70;
        local_c10 = in_stack_00000010;
        local_c20 = local_fe0;
        local_c28 = local_1100;
        local_c40 = &local_1048;
        local_af0 = local_f88;
        local_b00 = local_f68;
        local_b08 = local_f70;
        local_b10 = in_stack_00000010;
        local_b20 = local_fe0;
        local_b28 = local_1100;
        local_b48 = *(long *)(local_f88 + 0x30);
        local_b50 = *(long *)(local_f88 + 0x38);
        local_b58 = local_c18 & (ulong)local_f70;
        local_b60 = 0x7e4;
        local_b68 = 0x7e4;
        local_b70 = local_10f8;
        local_1048 = 0;
        local_1030 = 0;
        local_b40 = local_c40;
        local_b38 = local_c38;
        local_b30 = local_c30;
        local_b18 = local_c18;
        local_af8 = local_bf8;
        for (local_b78 = 0; local_b78 < (ulong)(long)*(int *)(local_af0 + 0x20);
            local_b78 = local_b78 + 1) {
          local_b80 = (ulong)local_b10[local_b78];
          local_b88 = local_b18 - local_b80;
          if ((((local_b88 < local_b18) && (local_b80 <= local_b28)) &&
              (local_b88 = (ulong)local_b08 & local_b88, local_b70 + local_b58 <= local_b08)) &&
             ((local_b70 + local_b88 <= local_b08 &&
              (local_b70[local_b00 + local_b58] == local_b70[local_b00 + local_b88])))) {
            local_aa0 = (ulong *)(local_b00 + local_b88);
            local_a90 = (ulong *)(local_b00 + local_b58);
            local_a98 = local_b20;
            local_a88 = local_aa0;
LAB_007ef08a:
            if (local_a98 < (char *)0x8) {
              while( true ) {
                bVar9 = false;
                if (local_a98 != (char *)0x0) {
                  bVar9 = (char)*local_a88 == (char)*local_a90;
                }
                if (!bVar9) break;
                local_a98 = local_a98 + -1;
                local_a90 = (ulong *)((long)local_a90 + 1);
                local_a88 = (ulong *)((long)local_a88 + 1);
              }
              local_a80 = (char *)((long)local_a88 - (long)local_aa0);
            }
            else {
              local_9e8 = local_a90;
              local_9f0 = *local_a90;
              local_9f8 = local_a88;
              local_a00 = *local_a88;
              local_aa8 = local_9f0 ^ local_a00;
              local_a90 = local_a90 + 1;
              if (local_aa8 == 0) goto LAB_007ef15c;
              iVar5 = 0;
              for (uVar6 = local_aa8; (uVar6 & 1) == 0; uVar6 = uVar6 >> 1 | 0x8000000000000000) {
                iVar5 = iVar5 + 1;
              }
              local_ab0 = (ulong)iVar5;
              local_a80 = (char *)((long)local_a88 + ((local_ab0 >> 3) - (long)local_aa0));
            }
            local_b90 = local_a80;
            if (((char *)0x2 < local_a80) || ((local_a80 == (char *)0x2 && (local_b78 < 2)))) {
              local_a78 = local_a80;
              local_b98 = (long)local_a80 * 0x87 + 0x78f;
              if (local_b68 < local_b98) {
                if (local_b78 != 0) {
                  local_a70 = local_b78;
                  local_b98 = local_b98 -
                              ((long)(int)(0x1ca10 >> ((byte)local_b78 & 0xe) & 0xe) + 0x27);
                }
                if (local_b68 < local_b98) {
                  local_b68 = local_b98;
                  local_b70 = local_a80;
                  *local_b40 = (ulong)local_a80;
                  local_b40[1] = local_b80;
                  local_b40[2] = local_b68;
                }
              }
            }
          }
        }
        local_880 = (long *)(local_b00 + local_b58);
        local_888 = *(long *)(local_af0 + 0x10);
        local_878 = *local_880;
        local_890 = local_878 * local_888;
        local_ba0 = local_890 >> 0x31;
        local_ba8 = local_b50 + (local_ba0 << ((byte)*(undefined4 *)(local_af0 + 0x1c) & 0x3f)) * 4;
        if (*(ulong *)(local_af0 + 8) < (ulong)*(ushort *)(local_b48 + local_ba0 * 2)) {
          local_1118 = (ulong)*(ushort *)(local_b48 + local_ba0 * 2) - *(long *)(local_af0 + 8);
        }
        else {
          local_1118 = 0;
        }
        local_bb0 = local_1118;
        local_9a8 = (int *)(local_b00 + local_b58);
        local_bb4 = *local_9a8;
        local_bc0 = local_b20 + -4;
        local_b78 = (ulong)*(ushort *)(local_b48 + local_ba0 * 2);
        local_9ac = local_bb4;
        local_870 = local_880;
        while (local_bb0 < local_b78) {
          local_b78 = local_b78 - 1;
          local_bc8 = (ulong)*(uint *)(local_ba8 + (local_b78 & *(uint *)(local_af0 + 0x18)) * 4);
          local_bd8 = local_b18 - local_bc8;
          if (local_b28 < local_bd8) break;
          local_bc8 = (ulong)local_b08 & local_bc8;
          if (((local_b70 + local_b58 <= local_b08) && (local_b70 + local_bc8 <= local_b08)) &&
             (local_b70[local_b00 + local_b58] == local_b70[local_b00 + local_bc8])) {
            local_9b8 = (int *)(local_b00 + local_bc8);
            local_bcc = *local_9b8;
            local_9bc = local_bcc;
            if (local_bb4 == local_bcc) {
              local_ad8 = (ulong *)(local_b00 + local_bc8 + 4);
              local_ac8 = (ulong *)(local_b00 + local_b58 + 4);
              local_ad0 = local_bc0;
              local_ac0 = local_ad8;
LAB_007ef6ac:
              if (local_ad0 < (char *)0x8) {
                while( true ) {
                  bVar9 = false;
                  if (local_ad0 != (char *)0x0) {
                    bVar9 = (char)*local_ac0 == (char)*local_ac8;
                  }
                  if (!bVar9) break;
                  local_ad0 = local_ad0 + -1;
                  local_ac8 = (ulong *)((long)local_ac8 + 1);
                  local_ac0 = (ulong *)((long)local_ac0 + 1);
                }
                local_ab8 = (char *)((long)local_ac0 - (long)local_ad8);
              }
              else {
                local_9c8 = local_ac8;
                local_9d0 = *local_ac8;
                local_9d8 = local_ac0;
                local_9e0 = *local_ac0;
                local_ae0 = local_9d0 ^ local_9e0;
                local_ac8 = local_ac8 + 1;
                if (local_ae0 == 0) goto LAB_007ef77e;
                iVar5 = 0;
                for (uVar6 = local_ae0; (uVar6 & 1) == 0; uVar6 = uVar6 >> 1 | 0x8000000000000000) {
                  iVar5 = iVar5 + 1;
                }
                local_ae8 = (ulong)iVar5;
                local_ab8 = (char *)((long)local_ac0 + ((local_ae8 >> 3) - (long)local_ad8));
              }
              local_be0 = local_ab8 + 4;
              iVar5 = 0x1f;
              if ((uint)local_bd8 != 0) {
                for (; (uint)local_bd8 >> iVar5 == 0; iVar5 = iVar5 + -1) {
                }
              }
              local_be8 = ((long)local_be0 * 0x87 + 0x780) - (ulong)(uint)(iVar5 * 0x1e);
              local_a68 = local_bd8;
              local_a60 = local_be0;
              local_9a0 = local_bd8;
              if (local_b68 < local_be8) {
                local_b70 = local_be0;
                local_b68 = local_be8;
                *local_b40 = (ulong)local_be0;
                local_b40[1] = local_bd8;
                local_b40[2] = local_b68;
              }
            }
          }
        }
        *(int *)(local_ba8 +
                (ulong)((uint)*(ushort *)(local_b48 + local_ba0 * 2) & *(uint *)(local_af0 + 0x18))
                * 4) = (int)local_b18;
        *(short *)(local_b48 + local_ba0 * 2) = *(short *)(local_b48 + local_ba0 * 2) + 1;
        if (local_b60 == local_b40[2]) {
          local_a10 = *(long *)(local_af0 + 0x28);
          local_a18 = (ulong *)(local_b00 + local_b58);
          local_a08 = local_af8;
          local_a20 = local_b20;
          local_a28 = local_b30;
          local_a30 = local_b38;
          local_a38 = local_b40;
          local_a3c = 0;
          if (*(ulong *)(local_a10 + 0x28) >> 7 <= *(ulong *)(local_a10 + 0x30)) {
            local_984 = (int)*local_a18;
            local_994 = local_984 * 0x1e35a7bd;
            local_a48 = (ulong)((local_994 >> 0x12) << 1);
            local_a50 = 0;
            local_990 = local_a18;
            local_980 = local_a18;
            while( true ) {
              uVar4 = 2;
              if (local_a3c != 0) {
                uVar4 = 1;
              }
              if (uVar4 <= local_a50) break;
              *(long *)(local_a10 + 0x28) = *(long *)(local_a10 + 0x28) + 1;
              if (*(char *)(local_a08[4] + local_a48) != '\0') {
                local_918 = (char *)(ulong)*(byte *)(local_a08[4] + local_a48);
                local_920 = (ulong)*(ushort *)(local_a08[3] + local_a48 * 2);
                local_910 = local_a08;
                local_928 = local_a18;
                local_930 = local_a20;
                local_938 = local_a28;
                local_940 = local_a30;
                local_948 = local_a38;
                local_950 = (ulong)*(uint *)(*local_a08 + 0x20 + (long)local_918 * 4) +
                            (long)local_918 * local_920;
                if (local_a20 < local_918) {
                  local_904 = 0;
                }
                else {
                  local_8e0 = (ulong *)(*(long *)(*local_a08 + 0xa8) + local_950);
                  local_8d8 = local_a18;
                  local_8f0 = local_a18;
                  local_8e8 = local_918;
LAB_007efc53:
                  if (local_8e8 < (char *)0x8) {
                    while( true ) {
                      bVar9 = false;
                      if (local_8e8 != (char *)0x0) {
                        bVar9 = (char)*local_8d8 == (char)*local_8e0;
                      }
                      if (!bVar9) break;
                      local_8e8 = local_8e8 + -1;
                      local_8e0 = (ulong *)((long)local_8e0 + 1);
                      local_8d8 = (ulong *)((long)local_8d8 + 1);
                    }
                    local_8d0 = (char *)((long)local_8d8 - (long)local_a18);
                  }
                  else {
                    local_8a0 = local_8e0;
                    local_8a8 = *local_8e0;
                    local_8b0 = local_8d8;
                    local_8b8 = *local_8d8;
                    local_8f8 = local_8a8 ^ local_8b8;
                    local_8e0 = local_8e0 + 1;
                    if (local_8f8 == 0) goto LAB_007efd25;
                    iVar5 = 0;
                    for (uVar6 = local_8f8; (uVar6 & 1) == 0;
                        uVar6 = uVar6 >> 1 | 0x8000000000000000) {
                      iVar5 = iVar5 + 1;
                    }
                    local_900 = (ulong)iVar5;
                    local_8d0 = (char *)((long)local_8d8 + ((local_900 >> 3) - (long)local_a18));
                  }
                  local_958 = local_8d0;
                  if ((local_918 < local_8d0 + *(uint *)((long)local_a08 + 0xc)) &&
                     (local_8d0 != (char *)0x0)) {
                    local_970 = (long)local_918 - (long)local_8d0;
                    local_978 = local_970 * 4 +
                                ((ulong)local_a08[2] >> ((char)local_970 * '\x06' & 0x3fU) & 0x3f);
                    local_960 = local_a28 + 1 + local_920 +
                                (local_978 << (local_918[*local_a08] & 0x3fU));
                    if (local_a30 < local_960) {
                      local_904 = 0;
                    }
                    else {
                      local_8c0 = local_8d0;
                      iVar5 = 0x1f;
                      if ((uint)local_960 != 0) {
                        for (; (uint)local_960 >> iVar5 == 0; iVar5 = iVar5 + -1) {
                        }
                      }
                      local_968 = ((long)local_8d0 * 0x87 + 0x780) - (ulong)(uint)(iVar5 * 0x1e);
                      local_8c8 = local_960;
                      local_898 = local_960;
                      if (local_968 < local_a38[2]) {
                        local_904 = 0;
                      }
                      else {
                        *local_a38 = (ulong)local_8d0;
                        *(int *)(local_948 + 3) = (int)local_918 - (int)local_958;
                        local_948[1] = local_960;
                        local_948[2] = local_968;
                        local_904 = 1;
                      }
                    }
                  }
                  else {
                    local_904 = 0;
                  }
                }
                local_a54 = local_904;
                if (local_904 != 0) {
                  *(long *)(local_a10 + 0x30) = *(long *)(local_a10 + 0x30) + 1;
                }
              }
              local_a50 = local_a50 + 1;
              local_a48 = local_a48 + 1;
            }
          }
        }
        local_f0 = (uint *)(local_bf0 + 0x40);
        local_f8 = local_bf8;
        local_100 = local_c00;
        local_108 = local_c08;
        local_110 = local_c10;
        local_118 = local_c18;
        local_120 = local_c20;
        local_128 = local_c28;
        local_130 = local_c30;
        local_138 = local_c38;
        local_140 = local_c40;
        local_148 = local_c18 & (ulong)local_c08;
        if ((char *)0x1f < local_c20) {
          for (local_150 = *(ulong *)(local_bf0 + 0x50); local_150 <= local_118;
              local_150 = local_150 + 1) {
            local_154 = *local_f0 & 0x3fffffff;
            local_155 = *(undefined1 *)(local_100 + (local_150 & (ulong)local_108));
            local_156 = *(undefined1 *)(local_100 + (local_150 + 0x20 & (ulong)local_108));
            local_160 = 0xffffffff;
            uVar3 = duckdb_brotli::HashRollingFunctionHROLLING
                              ((uint32_t)(in_stack_ffffffffffffee80 >> 0x20),
                               (uint8_t)(in_stack_ffffffffffffee80 >> 0x18),
                               (uint8_t)(in_stack_ffffffffffffee80 >> 0x10),
                               (uint32_t)((ulong)in_stack_ffffffffffffee78 >> 0x20),
                               (uint32_t)in_stack_ffffffffffffee78);
            *local_f0 = uVar3;
            if (local_154 < 0x1000000) {
              uVar4 = *(uint *)(*(long *)(local_f0 + 2) + (ulong)local_154 * 4);
              local_160 = (ulong)uVar4;
              *(int *)(*(long *)(local_f0 + 2) + (ulong)local_154 * 4) = (int)local_150;
              if ((local_150 == local_118) && (local_160 != 0xffffffff)) {
                uVar4 = (int)local_118 - uVar4;
                local_168 = (ulong)uVar4;
                if (local_168 <= local_128) {
                  local_170 = local_160 & (ulong)local_108;
                  local_d8 = (ulong *)(local_100 + local_170);
                  local_c8 = (ulong *)(local_100 + local_148);
                  local_d0 = local_120;
                  local_c0 = local_d8;
LAB_007f02f7:
                  if (local_d0 < (char *)0x8) {
                    while( true ) {
                      bVar9 = false;
                      if (local_d0 != (char *)0x0) {
                        bVar9 = (char)*local_c0 == (char)*local_c8;
                      }
                      if (!bVar9) break;
                      local_d0 = local_d0 + -1;
                      local_c8 = (ulong *)((long)local_c8 + 1);
                      local_c0 = (ulong *)((long)local_c0 + 1);
                    }
                    local_b8 = (char *)((long)local_c0 - (long)local_d8);
                  }
                  else {
                    local_88 = local_c8;
                    local_90 = *local_c8;
                    local_98 = local_c0;
                    local_a0 = *local_c0;
                    local_e0 = local_90 ^ local_a0;
                    local_c8 = local_c8 + 1;
                    if (local_e0 == 0) goto LAB_007f03c9;
                    iVar5 = 0;
                    for (uVar6 = local_e0; (uVar6 & 1) == 0; uVar6 = uVar6 >> 1 | 0x8000000000000000
                        ) {
                      iVar5 = iVar5 + 1;
                    }
                    local_e8 = (ulong)iVar5;
                    local_b8 = (char *)((long)local_c0 + ((local_e8 >> 3) - (long)local_d8));
                  }
                  local_178 = local_b8;
                  if (((char *)0x3 < local_b8) && ((char *)*local_140 < local_b8)) {
                    local_a8 = local_b8;
                    iVar5 = 0x1f;
                    if (uVar4 != 0) {
                      for (; uVar4 >> iVar5 == 0; iVar5 = iVar5 + -1) {
                      }
                    }
                    local_180 = ((long)local_b8 * 0x87 + 0x780) - (ulong)(uint)(iVar5 * 0x1e);
                    local_b0 = local_168;
                    local_80 = local_168;
                    if (local_140[2] < local_180) {
                      *local_140 = (ulong)local_b8;
                      local_140[1] = local_168;
                      local_140[2] = local_180;
                      *(undefined4 *)(local_140 + 3) = 0;
                    }
                  }
                }
              }
            }
          }
          *(ulong *)(local_f0 + 4) = local_118 + 1;
        }
        uVar6 = local_f60;
        if (local_1038 < local_1000 + 0xaf) break;
        uVar6 = local_f60 + 1;
        local_fa8 = local_fa8 + 1;
        local_1010 = local_1048;
        local_1008 = local_1040;
        local_1000 = local_1038;
        local_ff8 = CONCAT44(uStack_102c,local_1030);
        local_101c = local_101c + 1;
        if (3 < local_101c) break;
        local_c58 = 8;
        local_c60 = 4;
        uVar7 = local_f60 + 9;
        local_f60 = uVar6;
      } while (uVar7 < local_fb0);
      local_f60 = uVar6;
      local_fc8 = local_f60 + local_1010 * 2 + local_fc0;
      local_f00 = local_f60 + local_f98;
      local_f08 = local_f90;
      local_1138 = local_f00;
      if (local_f90 <= local_f00) {
        local_1138 = local_f90;
      }
      local_e88 = local_1138 + local_fd0;
      local_e80 = local_1008;
      if (local_e88 < local_1008) {
LAB_007f0912:
        local_e78 = local_1008 + 0xf;
      }
      else {
        local_e98 = local_1008 + 3;
        local_ea0 = local_e98 - *in_stack_00000010;
        local_ea8 = local_e98 - in_stack_00000010[1];
        if (local_1008 == (long)*in_stack_00000010) {
          local_e78 = 0;
        }
        else if (local_1008 == (long)in_stack_00000010[1]) {
          local_e78 = 1;
        }
        else if (local_ea0 < 7) {
          local_e78 = (ulong)(int)(0x9750468 >> ((byte)((local_ea0 & 0x3fffffff) << 2) & 0x1f) & 0xf
                                  );
        }
        else if (local_ea8 < 7) {
          local_e78 = (ulong)(int)(0xfdb1ace >> ((byte)((local_ea8 & 0x3fffffff) << 2) & 0x1f) & 0xf
                                  );
        }
        else if (local_1008 == (long)in_stack_00000010[2]) {
          local_e78 = 2;
        }
        else {
          if (local_1008 != (long)in_stack_00000010[3]) goto LAB_007f0912;
          local_e78 = 3;
        }
      }
      if ((local_1008 <= local_1138 + local_fd0) && (local_e78 != 0)) {
        in_stack_00000010[3] = in_stack_00000010[2];
        in_stack_00000010[2] = in_stack_00000010[1];
        in_stack_00000010[1] = *in_stack_00000010;
        *in_stack_00000010 = (int)local_1008;
        local_cc8 = local_f88;
        local_cb8 = local_f88;
        local_ca4 = *(int *)(local_f88 + 0x20);
        if (4 < local_ca4) {
          local_ca8 = *in_stack_00000010;
          in_stack_00000010[4] = local_ca8 + -1;
          in_stack_00000010[5] = local_ca8 + 1;
          in_stack_00000010[6] = local_ca8 + -2;
          in_stack_00000010[7] = local_ca8 + 2;
          in_stack_00000010[8] = local_ca8 + -3;
          in_stack_00000010[9] = local_ca8 + 3;
          if (10 < local_ca4) {
            local_cac = in_stack_00000010[1];
            in_stack_00000010[10] = local_cac + -1;
            in_stack_00000010[0xb] = local_cac + 1;
            in_stack_00000010[0xc] = local_cac + -2;
            in_stack_00000010[0xd] = local_cac + 2;
            in_stack_00000010[0xe] = local_cac + -3;
            in_stack_00000010[0xf] = local_cac + 3;
          }
        }
        local_290 = local_f88 + 0x40;
      }
      local_e48 = (uint *)(local_f80 + 0x38);
      local_e40 = in_stack_00000020;
      local_e50 = local_fa8;
      local_e58 = local_1010;
      local_e5c = (uint)local_ff8;
      local_e68 = local_e78;
      local_e6c = (uint)local_ff8 & 0xff;
      *in_stack_00000020 = (int)local_fa8;
      in_stack_00000020[1] = (uint)local_1010 | local_e6c << 0x19;
      local_db8 = (ulong)*(uint *)(local_f80 + 0x3c);
      local_dc0 = (ulong)*local_e48;
      local_dc8 = (ushort *)((long)in_stack_00000020 + 0xe);
      local_dd0 = in_stack_00000020 + 2;
      local_db0 = local_e78;
      if (local_e78 < local_db8 + 0x10) {
        *local_dc8 = (ushort)local_e78;
        *local_dd0 = 0;
      }
      else {
        bVar1 = (byte)*local_e48;
        local_dd8 = (1L << (bVar1 + 2 & 0x3f)) + ((local_e78 - 0x10) - local_db8);
        iVar5 = 0x1f;
        if ((uint)local_dd8 != 0) {
          for (; (uint)local_dd8 >> iVar5 == 0; iVar5 = iVar5 + -1) {
          }
        }
        local_de0 = (ulong)(iVar5 - 1U);
        local_de8 = (ulong)((1 << (bVar1 & 0x1f)) - 1);
        local_df0 = local_dd8 & local_de8;
        bVar8 = (byte)(iVar5 - 1U);
        local_df8 = local_dd8 >> (bVar8 & 0x3f) & 1;
        local_e00 = local_df8 + 2 << (bVar8 & 0x3f);
        local_e08 = local_de0 - local_dc0;
        *local_dc8 = (short)local_e08 * 0x400 |
                     (short)*(uint *)(local_f80 + 0x3c) + 0x10 +
                     (short)((local_e08 + -1) * 2 + local_df8 << (bVar1 & 0x3f)) + (short)local_df0;
        *local_dd0 = (int)(local_dd8 - local_e00 >> (bVar1 & 0x3f));
        local_da8 = local_dd8;
      }
      iVar5 = (uint)local_1010 + (uint)local_ff8;
      local_d88 = (ulong)iVar5;
      local_d8c = (uint)((*(ushort *)((long)in_stack_00000020 + 0xe) & 0x3ff) == 0);
      local_d98 = (ushort *)(in_stack_00000020 + 3);
      local_d80 = local_fa8;
      local_d70 = local_fa8;
      if (local_fa8 < 6) {
        local_d62 = (ushort)local_fa8;
      }
      else if (local_fa8 < 0x82) {
        local_d58 = local_fa8 - 2;
        local_d74 = 0x1f;
        if ((uint)local_d58 != 0) {
          for (; (uint)local_d58 >> local_d74 == 0; local_d74 = local_d74 + -1) {
          }
        }
        local_d74 = local_d74 + -1;
        local_d62 = (short)local_d74 * 2 + (short)(local_fa8 - 2 >> ((byte)local_d74 & 0x3f)) + 2;
      }
      else if (local_fa8 < 0x842) {
        local_d60 = local_fa8 - 0x42;
        iVar2 = 0x1f;
        if ((uint)local_d60 != 0) {
          for (; (uint)local_d60 >> iVar2 == 0; iVar2 = iVar2 + -1) {
          }
        }
        local_d62 = (short)iVar2 + 10;
      }
      else if (local_fa8 < 0x1842) {
        local_d62 = 0x15;
      }
      else if (local_fa8 < 0x5842) {
        local_d62 = 0x16;
      }
      else {
        local_d62 = 0x17;
      }
      local_d9a = local_d62;
      if (local_d88 < 10) {
        local_d3a = (short)iVar5 - 2;
      }
      else if (local_d88 < 0x86) {
        local_d30 = local_d88 - 6;
        local_d4c = 0x1f;
        if ((uint)local_d30 != 0) {
          for (; (uint)local_d30 >> local_d4c == 0; local_d4c = local_d4c + -1) {
          }
        }
        local_d4c = local_d4c + -1;
        local_d3a = (short)local_d4c * 2 + (short)(local_d88 - 6 >> ((byte)local_d4c & 0x3f)) + 4;
      }
      else if (local_d88 < 0x846) {
        local_d38 = local_d88 - 0x46;
        iVar5 = 0x1f;
        if ((uint)local_d38 != 0) {
          for (; (uint)local_d38 >> iVar5 == 0; iVar5 = iVar5 + -1) {
          }
        }
        local_d3a = (short)iVar5 + 0xc;
      }
      else {
        local_d3a = 0x17;
      }
      local_d9c = local_d3a;
      local_d14 = local_d62;
      local_d16 = local_d3a;
      local_d1e = local_d3a & 7 | (local_d62 & 7) << 3;
      if (((local_d8c == 0) || (7 < local_d62)) || (0xf < local_d3a)) {
        iVar5 = ((int)(uint)local_d3a >> 3) + ((int)(uint)local_d62 >> 3) * 3;
        local_d24 = iVar5 * 0x40 + 0x40 + (0x520d40U >> ((char)iVar5 * '\x02' & 0x1fU) & 0xc0);
        local_d12 = (ushort)local_d24 | local_d1e;
      }
      else {
        local_d12 = local_d1e;
        if (7 < local_d3a) {
          local_d12 = local_d1e | 0x40;
        }
      }
      *local_d98 = local_d12;
      *in_stack_00000030 = local_fa8 + *in_stack_00000030;
      local_fa8 = 0;
      uVar6 = local_f60 + 2;
      local_f10 = local_f60 + local_1010;
      local_f18 = local_fb8;
      local_1150 = local_f10;
      if (local_fb8 <= local_f10) {
        local_1150 = local_fb8;
      }
      local_1058 = uVar6;
      if (local_1008 < local_1010 >> 2) {
        local_e18 = local_f60 + local_1010 + local_1008 * -4;
        local_1160 = local_e18;
        if (local_e18 < uVar6) {
          local_1160 = uVar6;
        }
        local_f20 = local_1150;
        local_f28 = local_1160;
        if (local_1150 < local_1160) {
          local_1168 = local_1150;
        }
        else {
          local_1168 = local_1160;
        }
        local_1058 = local_1168;
        local_e10 = uVar6;
      }
      local_470 = local_f88;
      local_478 = local_f68;
      local_480 = local_f70;
      local_488 = local_1058;
      local_490 = local_1150;
      local_440 = local_f88;
      local_448 = local_f68;
      local_450 = local_f70;
      local_458 = local_1058;
      local_460 = local_1150;
      for (local_468 = local_1058; local_468 < local_1150; local_468 = local_468 + 1) {
        local_3f8 = local_f88;
        local_410 = local_468;
        local_418 = *(long *)(local_f88 + 0x30);
        local_420 = *(long *)(local_f88 + 0x38);
        local_3e0 = (long *)(local_f68 + (local_468 & (ulong)local_f70));
        local_3e8 = *(long *)(local_f88 + 0x10);
        local_3d8 = *local_3e0;
        local_3f0 = local_3d8 * local_3e8;
        local_428 = local_3f0 >> 0x31;
        local_430 = (ulong)((uint)*(ushort *)(local_418 + local_428 * 2) &
                           *(uint *)(local_f88 + 0x18));
        local_438 = local_430 + (local_428 << ((byte)*(undefined4 *)(local_f88 + 0x1c) & 0x3f));
        *(short *)(local_418 + local_428 * 2) = *(short *)(local_418 + local_428 * 2) + 1;
        *(int *)(local_420 + local_438 * 4) = (int)local_468;
        local_3d0 = local_3e0;
      }
      local_58 = local_f88 + 0x40;
      local_60 = local_f68;
      local_68 = local_f70;
      local_70 = local_1058;
      local_78 = local_1150;
      in_stack_00000020 = in_stack_00000020 + 4;
      uVar6 = local_1010 + local_f60;
      local_d48 = local_d88;
      local_d1c = local_d8c;
      goto LAB_007ecf38;
    }
    local_fa8 = local_fa8 + 1;
    uVar6 = local_f60 + 1;
    if (local_fc8 < uVar6) {
      if (local_fc8 + local_fc0 * 4 < uVar6) {
        local_cf8 = 8;
        local_d00 = 4;
        local_e20 = 7;
        local_e28 = 4;
        local_f30 = local_f60 + 0x11;
        local_f38 = local_fb0 - 7;
        local_f60 = uVar6;
        in_stack_ffffffffffffee80 = local_f38;
        if (local_f30 < local_f38) {
          in_stack_ffffffffffffee80 = local_f30;
        }
        for (; uVar6 = local_f60, local_f60 < in_stack_ffffffffffffee80; local_f60 = local_f60 + 4)
        {
          local_320 = local_f88;
          local_338 = local_f60;
          local_2d8 = local_f88;
          local_2f0 = local_f60;
          local_2f8 = *(long *)(local_f88 + 0x30);
          local_300 = *(long *)(local_f88 + 0x38);
          local_2c0 = (long *)(local_f68 + (local_f60 & (ulong)local_f70));
          local_2c8 = *(long *)(local_f88 + 0x10);
          local_2b8 = *local_2c0;
          local_2d0 = local_2b8 * local_2c8;
          local_308 = local_2d0 >> 0x31;
          local_310 = (ulong)((uint)*(ushort *)(local_2f8 + local_308 * 2) &
                             *(uint *)(local_f88 + 0x18));
          local_318 = local_310 + (local_308 << ((byte)*(undefined4 *)(local_f88 + 0x1c) & 0x3f));
          *(short *)(local_2f8 + local_308 * 2) = *(short *)(local_2f8 + local_308 * 2) + 1;
          *(int *)(local_300 + local_318 * 4) = (int)local_f60;
          local_38 = local_f88 + 0x40;
          local_50 = local_f60;
          local_fa8 = local_fa8 + 4;
          local_2b0 = local_2c0;
        }
      }
      else {
        local_d08 = 8;
        local_d10 = 4;
        in_stack_ffffffffffffee78 = 8;
        local_e30 = 7;
        local_e38 = 2;
        local_f40 = local_f60 + 9;
        local_f48 = local_fb0 - 7;
        local_f60 = uVar6;
        local_1198 = local_f48;
        if (local_f40 < local_f48) {
          local_1198 = local_f40;
        }
        for (; uVar6 = local_f60, local_f60 < local_1198; local_f60 = local_f60 + 2) {
          local_3b0 = local_f88;
          local_3c8 = local_f60;
          local_368 = local_f88;
          local_380 = local_f60;
          local_388 = *(long *)(local_f88 + 0x30);
          local_390 = *(long *)(local_f88 + 0x38);
          local_350 = (long *)(local_f68 + (local_f60 & (ulong)local_f70));
          local_358 = *(long *)(local_f88 + 0x10);
          local_348 = *local_350;
          local_360 = local_348 * local_358;
          local_398 = local_360 >> 0x31;
          local_3a0 = (ulong)((uint)*(ushort *)(local_388 + local_398 * 2) &
                             *(uint *)(local_f88 + 0x18));
          local_3a8 = local_3a0 + (local_398 << ((byte)*(undefined4 *)(local_f88 + 0x1c) & 0x3f));
          *(short *)(local_388 + local_398 * 2) = *(short *)(local_388 + local_398 * 2) + 1;
          *(int *)(local_390 + local_3a8 * 4) = (int)local_f60;
          local_18 = local_f88 + 0x40;
          local_30 = local_f60;
          local_fa8 = local_fa8 + 2;
          local_340 = local_350;
        }
      }
    }
  } while( true );
LAB_007ed62d:
  local_6b0 = local_6b0 + 1;
  local_6c0 = local_6c0 + -8;
  goto LAB_007ed55b;
LAB_007edc4f:
  local_6e8 = local_6e8 + 1;
  local_6f8 = local_6f8 + -8;
  goto LAB_007edb7d;
LAB_007ee202:
  local_500 = local_500 + 1;
  local_510 = local_510 + -8;
  goto LAB_007ee130;
LAB_007ee8b2:
  local_1c8 = local_1c8 + 1;
  local_1d8 = local_1d8 + -8;
  goto LAB_007ee7e0;
LAB_007ef15c:
  local_a88 = local_a88 + 1;
  local_a98 = local_a98 + -8;
  goto LAB_007ef08a;
LAB_007ef77e:
  local_ac0 = local_ac0 + 1;
  local_ad0 = local_ad0 + -8;
  goto LAB_007ef6ac;
LAB_007efd25:
  local_8d8 = local_8d8 + 1;
  local_8e8 = local_8e8 + -8;
  goto LAB_007efc53;
LAB_007f03c9:
  local_c0 = local_c0 + 1;
  local_d0 = local_d0 + -8;
  goto LAB_007f02f7;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = params->dictionary.compound.total_size;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    int dict_id = 0;
    uint8_t p1 = 0;
    uint8_t p2 = 0;
    if (params->dictionary.contextual.context_based) {
      p1 = position >= 1 ?
          ringbuffer[(size_t)(position - 1) & ringbuffer_mask] : 0;
      p2 = position >= 2 ?
          ringbuffer[(size_t)(position - 2) & ringbuffer_mask] : 0;
      dict_id = params->dictionary.contextual.context_map[
          BROTLI_CONTEXT(p1, p2, literal_context_lut)];
    }
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    FN(FindLongestMatch)(privat, params->dictionary.contextual.dict[dict_id],
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance, &sr);
    if (ENABLE_COMPOUND_DICTIONARY) {
      LookupCompoundDictionaryMatch(&params->dictionary.compound, ringbuffer,
          ringbuffer_mask, dist_cache, position, max_length,
          dictionary_start, params->dist.max_distance, &sr);
    }
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 175;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_code_delta = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        dictionary_start = BROTLI_MIN(size_t,
            position + 1 + position_offset, max_backward_limit);
        if (params->dictionary.contextual.context_based) {
          p2 = p1;
          p1 = ringbuffer[position & ringbuffer_mask];
          dict_id = params->dictionary.contextual.context_map[
              BROTLI_CONTEXT(p1, p2, literal_context_lut)];
        }
        FN(FindLongestMatch)(privat,
            params->dictionary.contextual.dict[dict_id],
            ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
            max_distance, dictionary_start + gap, params->dist.max_distance,
            &sr2);
        if (ENABLE_COMPOUND_DICTIONARY) {
          LookupCompoundDictionaryMatch(
              &params->dictionary.compound, ringbuffer,
              ringbuffer_mask, dist_cache, position + 1, max_length,
              dictionary_start, params->dist.max_distance, &sr2);
        }
        if (sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}